

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O3

idx_t __thiscall duckdb::JoinHashTable::GetRemainingSize(JoinHashTable *this)

{
  idx_t iVar1;
  pointer this_00;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar2;
  pointer pTVar3;
  idx_t *piVar4;
  idx_t iVar5;
  ulong uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  double dVar13;
  long local_38;
  
  iVar1 = this->radix_bits;
  this_00 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
            ::operator->(&this->sink_collection);
  puVar2 = PartitionedTupleData::GetPartitions(this_00);
  uVar11 = 1;
  lVar9 = 0;
  local_38 = 0;
  lVar10 = 0;
  do {
    if (((this->completed_partitions).super_TemplatedValidityMask<unsigned_long>.validity_mask
         [uVar11 - 1 >> 6] >> (uVar11 - 1 & 0x3f) & 1) == 0) {
      pTVar3 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
               ::operator->((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                             *)((long)&(((puVar2->
                                         super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                       )._M_t + lVar9));
      piVar4 = TupleDataCollection::Count(pTVar3);
      lVar10 = lVar10 + *piVar4;
      pTVar3 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
               ::operator->((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                             *)((long)&(((puVar2->
                                         super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                       )._M_t + lVar9));
      iVar5 = TupleDataCollection::SizeInBytes(pTVar3);
      local_38 = local_38 + iVar5;
    }
    uVar6 = uVar11 >> ((byte)iVar1 & 0x3f);
    uVar11 = uVar11 + 1;
    lVar9 = lVar9 + 8;
  } while (uVar6 == 0);
  auVar12._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar12._0_8_ = lVar10;
  auVar12._12_4_ = 0x45300000;
  dVar13 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) * this->load_factor;
  uVar11 = (ulong)dVar13;
  uVar7 = NextPowerOfTwo((long)(dVar13 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11);
  uVar8 = 0x4000;
  if (0x4000 < uVar7) {
    uVar8 = uVar7;
  }
  return local_38 + uVar8 * 8;
}

Assistant:

idx_t JoinHashTable::GetRemainingSize() const {
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);
	auto &partitions = sink_collection->GetPartitions();

	idx_t count = 0;
	idx_t data_size = 0;
	for (idx_t partition_idx = 0; partition_idx < num_partitions; partition_idx++) {
		if (completed_partitions.RowIsValidUnsafe(partition_idx)) {
			continue;
		}
		count += partitions[partition_idx]->Count();
		data_size += partitions[partition_idx]->SizeInBytes();
	}

	return data_size + PointerTableSize(count);
}